

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.hpp
# Opt level: O2

void __thiscall Callable::~Callable(Callable *this)

{
  std::_Function_base::~_Function_base(&(this->one_).super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

Callable(std::function<void()> f) : zero_(f) {}